

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  uint uVar1;
  void *pvVar2;
  ImGuiColumnsSet *pIVar3;
  Pair *pPVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if (this->DrawList != &this->DrawListInst) {
    __assert_fail("DrawList == &DrawListInst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x7c2,"ImGuiWindow::~ImGuiWindow()");
  }
  if (this->Name != (char *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(this->Name,GImAllocatorUserData);
  }
  uVar1 = (this->ColumnsStorage).Size;
  uVar6 = (ulong)uVar1;
  if (uVar1 != 0) {
    lVar8 = 0x38;
    uVar7 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar7) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiColumnsSet>::operator[](int) [T = ImGuiColumnsSet]"
                     );
      }
      pvVar2 = *(void **)((long)&((this->ColumnsStorage).Data)->ID + lVar8);
      if (pvVar2 != (void *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        (*GImAllocatorFreeFunc)(pvVar2,GImAllocatorUserData);
      }
      uVar7 = uVar7 + 1;
      uVar6 = (ulong)(uint)(this->ColumnsStorage).Size;
      lVar8 = lVar8 + 0x40;
    } while (uVar7 != uVar6);
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  pIVar3 = (this->ColumnsStorage).Data;
  if (pIVar3 != (ImGuiColumnsSet *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
  }
  pPVar4 = (this->StateStorage).Data.Data;
  if (pPVar4 != (Pair *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pPVar4,GImAllocatorUserData);
  }
  puVar5 = (this->IDStack).Data;
  if (puVar5 != (uint *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
  }
  ImGuiDrawContext::~ImGuiDrawContext(&this->DC);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumnsSet();
}